

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_wnorm
                   (char_t *s,char_t end_quote)

{
  byte *pbVar1;
  long lVar2;
  byte bVar3;
  char_t *pcVar4;
  byte bVar5;
  size_t sVar6;
  byte *s_00;
  gap g;
  byte *local_40;
  gap local_38;
  
  local_38.end = (char_t *)0x0;
  local_38.size = 0;
  local_40 = (byte *)s;
  if (((anonymous_namespace)::chartype_table[(byte)*s] & 8) != 0) {
    sVar6 = 0;
    do {
      lVar2 = sVar6 + 1;
      sVar6 = sVar6 + 1;
    } while (((anonymous_namespace)::chartype_table[(byte)s[lVar2]] & 8) != 0);
    gap::push(&local_38,(char_t **)&local_40,sVar6);
  }
  do {
    s_00 = local_40 + 3;
    while( true ) {
      bVar3 = s_00[-3];
      bVar5 = (anonymous_namespace)::chartype_table[bVar3];
      if ((bVar5 & 0xc) != 0) break;
      bVar3 = s_00[-2];
      bVar5 = (anonymous_namespace)::chartype_table[bVar3];
      if ((bVar5 & 0xc) != 0) {
        s_00 = s_00 + -2;
        goto LAB_002b83d4;
      }
      bVar3 = s_00[-1];
      bVar5 = (anonymous_namespace)::chartype_table[bVar3];
      if ((bVar5 & 0xc) != 0) {
        s_00 = s_00 + -1;
        goto LAB_002b83d4;
      }
      bVar3 = *s_00;
      bVar5 = (anonymous_namespace)::chartype_table[bVar3];
      if ((bVar5 & 0xc) != 0) goto LAB_002b83d4;
      s_00 = s_00 + 4;
    }
    s_00 = s_00 + -3;
LAB_002b83d4:
    local_40 = s_00;
    if (bVar3 == end_quote) {
      pcVar4 = gap::flush(&local_38,(char_t *)s_00);
      do {
        *pcVar4 = '\0';
        pbVar1 = (byte *)(pcVar4 + -1);
        pcVar4 = pcVar4 + -1;
      } while (((anonymous_namespace)::chartype_table[*pbVar1] & 8) != 0);
      return (char_t *)(s_00 + 1);
    }
    if ((bVar5 & 8) == 0) {
      if (bVar3 == 0x26) {
        local_40 = (byte *)strconv_escape((char_t *)s_00,&local_38);
      }
      else {
        if (bVar3 == 0) {
          return (char_t *)0x0;
        }
        local_40 = s_00 + 1;
      }
    }
    else {
      local_40 = s_00 + 1;
      *s_00 = 0x20;
      if (((anonymous_namespace)::chartype_table[s_00[1]] & 8) != 0) {
        sVar6 = 0;
        do {
          lVar2 = sVar6 + 2;
          sVar6 = sVar6 + 1;
        } while (((anonymous_namespace)::chartype_table[s_00[lVar2]] & 8) != 0);
        gap::push(&local_38,(char_t **)&local_40,sVar6);
      }
    }
  } while( true );
}

Assistant:

static char_t* parse_wnorm(char_t* s, char_t end_quote)
		{
			gap g;

			// trim leading whitespaces
			if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
			{
				char_t* str = s;

				do ++str;
				while (PUGI_IMPL_IS_CHARTYPE(*str, ct_space));

				g.push(s, str - s);
			}

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_attr_ws | ct_space));

				if (*s == end_quote)
				{
					char_t* str = g.flush(s);

					do *str-- = 0;
					while (PUGI_IMPL_IS_CHARTYPE(*str, ct_space));

					return s + 1;
				}
				else if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
				{
					*s++ = ' ';

					if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
					{
						char_t* str = s + 1;
						while (PUGI_IMPL_IS_CHARTYPE(*str, ct_space)) ++str;

						g.push(s, str - s);
					}
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return 0;
				}
				else ++s;
			}
		}